

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswmcpl.c
# Opt level: O3

void ssw2mcpl_parse_args(int argc,char **argv,char **infile,char **outfile,char **cfgfile,
                        int *double_prec,int *surface_info,int *do_gzip)

{
  char cVar1;
  int iVar2;
  int *piVar3;
  char **ppcVar4;
  void *__ptr;
  int iVar5;
  char *__s2;
  char *pcVar6;
  
  *cfgfile = (char *)0x0;
  *infile = (char *)0x0;
  *outfile = (char *)0x0;
  *surface_info = 0;
  *double_prec = 0;
  *do_gzip = 1;
  if (1 < argc) {
    iVar5 = 1;
    do {
      pcVar6 = argv[iVar5];
      cVar1 = *pcVar6;
      if (cVar1 != '\0') {
        piVar3 = double_prec;
        if (cVar1 == '-') {
          if (((pcVar6[1] == 'h') && (pcVar6[2] == '\0')) ||
             (iVar2 = strcmp(pcVar6,"--help"), iVar2 == 0)) {
LAB_00104228:
            __ptr = (void *)mcpl_usage_progname(*argv);
            puts("Usage:\n");
            printf("  %s [options] input.ssw [output.mcpl]\n\n",__ptr);
            puts(
                "Converts the Monte Carlo particles in the input.ssw file (MCNP Surface\nSource Write format) to MCPL format and stores in the designated output\nfile (defaults to \"output.mcpl\").\n\nOptions:\n\n  -h, --help   : Show this usage information.\n  -d, --double : Enable double-precision storage of floating point values.\n  -s, --surf   : Store SSW surface IDs in the MCPL userflags.\n  -n, --nogzip : Do not attempt to gzip output file.\n  -c FILE      : Embed entire configuration FILE (the input deck)\n                 used to produce input.ssw in the MCPL header."
                );
            free(__ptr);
            exit(0);
          }
          if ((pcVar6[1] == 'c') && (pcVar6[2] == '\0')) {
            iVar5 = iVar5 + 1;
            if ((iVar5 == argc) || (*argv[iVar5] == '-')) {
              pcVar6 = "Error: Missing argument for -c";
              goto LAB_001042aa;
            }
            if (*cfgfile != (char *)0x0) {
              pcVar6 = "Error: -c specified more than once";
              goto LAB_001042aa;
            }
            *cfgfile = argv[iVar5];
          }
          else {
            if (pcVar6[1] == 'd') {
              if (pcVar6[2] == '\0') goto LAB_00104161;
              iVar2 = strcmp(pcVar6,"--double");
            }
            else {
              iVar2 = strcmp(pcVar6,"--double");
            }
            if (((iVar2 == 0) || ((pcVar6[1] == 's' && (piVar3 = surface_info, pcVar6[2] == '\0'))))
               || (iVar2 = strcmp(pcVar6,"--surf"), piVar3 = surface_info, iVar2 == 0))
            goto LAB_00104161;
LAB_0010412f:
            if (pcVar6[1] == 'n') {
              if ((pcVar6[2] != '\0') && (iVar2 = strcmp(pcVar6,"--nogzip"), iVar2 != 0)) {
LAB_00104275:
                printf("Error: Unknown argument: %s\n",pcVar6);
                goto LAB_001042af;
              }
            }
            else {
              iVar2 = strcmp(pcVar6,"--nogzip");
              if (iVar2 != 0) {
                if (cVar1 != '-') goto LAB_00104186;
                goto LAB_00104275;
              }
            }
LAB_001041a4:
            *do_gzip = 0;
          }
        }
        else {
          iVar2 = strcmp(pcVar6,"--help");
          if (iVar2 == 0) goto LAB_00104228;
          iVar2 = strcmp(pcVar6,"--double");
          if ((iVar2 == 0) || (iVar2 = strcmp(pcVar6,"--surf"), piVar3 = surface_info, iVar2 == 0))
          {
LAB_00104161:
            *piVar3 = 1;
          }
          else {
            if (cVar1 == '-') goto LAB_0010412f;
            iVar2 = strcmp(pcVar6,"--nogzip");
            if (iVar2 == 0) goto LAB_001041a4;
LAB_00104186:
            ppcVar4 = infile;
            if ((*infile != (char *)0x0) && (ppcVar4 = outfile, *outfile != (char *)0x0)) {
              pcVar6 = "Error: Too many arguments! (run with -h or --help for usage instructions)";
              goto LAB_001042aa;
            }
            *ppcVar4 = pcVar6;
          }
        }
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < argc);
  }
  pcVar6 = *infile;
  if (pcVar6 == (char *)0x0) {
    pcVar6 = "Error: Too few arguments! (run with -h or --help for usage instructions)";
  }
  else {
    __s2 = *outfile;
    if (__s2 == (char *)0x0) {
      __s2 = "output.mcpl";
      *outfile = "output.mcpl";
      pcVar6 = *infile;
    }
    iVar5 = strcmp(pcVar6,__s2);
    if (iVar5 != 0) {
      return;
    }
    pcVar6 = "Error: input and output files are identical.";
  }
LAB_001042aa:
  puts(pcVar6);
LAB_001042af:
  exit(1);
}

Assistant:

void ssw2mcpl_parse_args(int argc,char **argv, const char** infile,
                         const char **outfile, const char **cfgfile,
                         int* double_prec, int* surface_info, int* do_gzip) {
  *cfgfile = 0;
  *infile = 0;
  *outfile = 0;
  *surface_info = 0;
  *double_prec = 0;
  *do_gzip = 1;
  int i;
  for (i=1; i < argc; ++i) {
    if (argv[i][0]=='\0')
      continue;
    if (strcmp(argv[i],"-h")==0||strcmp(argv[i],"--help")==0) {
      char * progname = mcpl_usage_progname(argv[0]);
      printf("Usage:\n\n");
      printf("  %s [options] input.ssw [output.mcpl]\n\n",progname);
      printf("Converts the Monte Carlo particles in the input.ssw file (MCNP Surface\n"
             "Source Write format) to MCPL format and stores in the designated output\n"
             "file (defaults to \"output.mcpl\").\n"
             "\n"
             "Options:\n"
             "\n"
             "  -h, --help   : Show this usage information.\n"
             "  -d, --double : Enable double-precision storage of floating point values.\n"
             "  -s, --surf   : Store SSW surface IDs in the MCPL userflags.\n"
             "  -n, --nogzip : Do not attempt to gzip output file.\n"
             "  -c FILE      : Embed entire configuration FILE (the input deck)\n"
             "                 used to produce input.ssw in the MCPL header.\n"
             );
      free(progname);
      exit(0);
    }
    if (strcmp(argv[i],"-c")==0) {
      if (i+1==argc||argv[i+1][0]=='-') {
        printf("Error: Missing argument for -c\n");
        exit(1);
      }
      ++i;
      if (*cfgfile) {
        printf("Error: -c specified more than once\n");
        exit(1);
      }
      *cfgfile = argv[i];
      continue;
    }

    if (strcmp(argv[i],"-d")==0||strcmp(argv[i],"--double")==0) {
      *double_prec = 1;
      continue;
    }
    if (strcmp(argv[i],"-s")==0||strcmp(argv[i],"--surf")==0) {
      *surface_info = 1;
      continue;
    }
    if (strcmp(argv[i],"-n")==0||strcmp(argv[i],"--nogzip")==0) {
      *do_gzip = 0;
      continue;
    }
    if (argv[i][0]=='-') {
      printf("Error: Unknown argument: %s\n",argv[i]);
      exit(1);
    }
    if (!*infile) {
      *infile = argv[i];
      continue;
    }
    if (!*outfile) {
      *outfile = argv[i];
      continue;
    }
    printf("Error: Too many arguments! (run with -h or --help for usage instructions)\n");
    exit(1);
  }
  if (!*infile) {
    printf("Error: Too few arguments! (run with -h or --help for usage instructions)\n");
    exit(1);
  }
  if (!*outfile)
    *outfile = "output.mcpl";
  if (strcmp(*infile,*outfile)==0) {
    //basic test, easy to cheat:
    printf("Error: input and output files are identical.\n");
    exit(1);
  }
}